

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_ld(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 pTVar2;
  TCGTemp *a2;
  uint uVar3;
  uintptr_t o;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_1;
  TCGv_i64 EA;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  if (((uVar1 & 1) != 0) &&
     ((uVar3 = uVar1 >> 0x10 & 0x1f, uVar3 == 0 || (uVar3 == (uVar1 >> 0x15 & 0x1f))))) {
    gen_exception_err(ctx,0x60,0x21);
    return;
  }
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x20
                     );
    ctx->access_type = 0x20;
  }
  a2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  EA = (TCGv_i64)((long)a2 - (long)tcg_ctx_00);
  gen_addr_imm_index(ctx,EA,3);
  tcg_gen_qemu_ld_i64_ppc64
            (ctx->uc->tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),EA,
             (long)ctx->mem_idx,((ctx->opcode & 2) >> 1) * 3 + MO_64 | ctx->default_tcg_memop_mask);
  if (((ctx->opcode & 1) != 0) &&
     (pTVar2 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)), pTVar2 != EA)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(pTVar2 + (long)tcg_ctx_00),(TCGArg)a2);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(EA + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_ld(DisasContext *ctx, uint32_t opc,
                   int rt, int base, int offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1, t2;
    int mem_idx = ctx->mem_idx;

    if (rt == 0 && ctx->insn_flags & (INSN_LOONGSON2E | INSN_LOONGSON2F)) {
        /*
         * Loongson CPU uses a load to zero register for prefetch.
         * We emulate it as a NOP. On other CPU we must perform the
         * actual memory access.
         */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_base_offset_addr(ctx, t0, base, offset);

    switch (opc) {
#if defined(TARGET_MIPS64)
    case OPC_LWU:
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TEUL |
                           ctx->default_tcg_memop_mask);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LD:
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TEQ |
                           ctx->default_tcg_memop_mask);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LLD:
    case R6_OPC_LLD:
        op_ld_lld(tcg_ctx, t0, t0, mem_idx, ctx);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LDL:
        t1 = tcg_temp_new(tcg_ctx);
        /*
         * Do a byte access to possibly trigger a page
         * fault with the unaligned address.
         */
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, mem_idx, MO_UB);
        tcg_gen_andi_tl(tcg_ctx, t1, t0, 7);
#ifndef TARGET_WORDS_BIGENDIAN
        tcg_gen_xori_tl(tcg_ctx, t1, t1, 7);
#endif
        tcg_gen_shli_tl(tcg_ctx, t1, t1, 3);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, ~7);
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TEQ);
        tcg_gen_shl_tl(tcg_ctx, t0, t0, t1);
        t2 = tcg_const_tl(tcg_ctx, -1);
        tcg_gen_shl_tl(tcg_ctx, t2, t2, t1);
        gen_load_gpr(tcg_ctx, t1, rt);
        tcg_gen_andc_tl(tcg_ctx, t1, t1, t2);
        tcg_temp_free(tcg_ctx, t2);
        tcg_gen_or_tl(tcg_ctx, t0, t0, t1);
        tcg_temp_free(tcg_ctx, t1);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LDR:
        t1 = tcg_temp_new(tcg_ctx);
        /*
         * Do a byte access to possibly trigger a page
         * fault with the unaligned address.
         */
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, mem_idx, MO_UB);
        tcg_gen_andi_tl(tcg_ctx, t1, t0, 7);
#ifdef TARGET_WORDS_BIGENDIAN
        tcg_gen_xori_tl(tcg_ctx, t1, t1, 7);
#endif
        tcg_gen_shli_tl(tcg_ctx, t1, t1, 3);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, ~7);
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TEQ);
        tcg_gen_shr_tl(tcg_ctx, t0, t0, t1);
        tcg_gen_xori_tl(tcg_ctx, t1, t1, 63);
        t2 = tcg_const_tl(tcg_ctx, 0xfffffffffffffffeull);
        tcg_gen_shl_tl(tcg_ctx, t2, t2, t1);
        gen_load_gpr(tcg_ctx, t1, rt);
        tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
        tcg_temp_free(tcg_ctx, t2);
        tcg_gen_or_tl(tcg_ctx, t0, t0, t1);
        tcg_temp_free(tcg_ctx, t1);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LDPC:
        t1 = tcg_const_tl(tcg_ctx, pc_relative_pc(ctx));
        gen_op_addr_add(ctx, t0, t0, t1);
        tcg_temp_free(tcg_ctx, t1);
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TEQ);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
#endif
    case OPC_LWPC:
        t1 = tcg_const_tl(tcg_ctx, pc_relative_pc(ctx));
        gen_op_addr_add(ctx, t0, t0, t1);
        tcg_temp_free(tcg_ctx, t1);
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TESL);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LWE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_LW:
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TESL |
                           ctx->default_tcg_memop_mask);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LHE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_LH:
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TESW |
                           ctx->default_tcg_memop_mask);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LHUE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_LHU:
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TEUW |
                           ctx->default_tcg_memop_mask);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LBE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_LB:
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_SB);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LBUE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_LBU:
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_UB);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LWLE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_LWL:
        t1 = tcg_temp_new(tcg_ctx);
        /*
         * Do a byte access to possibly trigger a page
         * fault with the unaligned address.
         */
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, mem_idx, MO_UB);
        tcg_gen_andi_tl(tcg_ctx, t1, t0, 3);
#ifndef TARGET_WORDS_BIGENDIAN
        tcg_gen_xori_tl(tcg_ctx, t1, t1, 3);
#endif
        tcg_gen_shli_tl(tcg_ctx, t1, t1, 3);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, ~3);
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TEUL);
        tcg_gen_shl_tl(tcg_ctx, t0, t0, t1);
        t2 = tcg_const_tl(tcg_ctx, -1);
        tcg_gen_shl_tl(tcg_ctx, t2, t2, t1);
        gen_load_gpr(tcg_ctx, t1, rt);
        tcg_gen_andc_tl(tcg_ctx, t1, t1, t2);
        tcg_temp_free(tcg_ctx, t2);
        tcg_gen_or_tl(tcg_ctx, t0, t0, t1);
        tcg_temp_free(tcg_ctx, t1);
        tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LWRE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_LWR:
        t1 = tcg_temp_new(tcg_ctx);
        /*
         * Do a byte access to possibly trigger a page
         * fault with the unaligned address.
         */
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, mem_idx, MO_UB);
        tcg_gen_andi_tl(tcg_ctx, t1, t0, 3);
#ifdef TARGET_WORDS_BIGENDIAN
        tcg_gen_xori_tl(tcg_ctx, t1, t1, 3);
#endif
        tcg_gen_shli_tl(tcg_ctx, t1, t1, 3);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, ~3);
        tcg_gen_qemu_ld_tl(tcg_ctx, t0, t0, mem_idx, MO_TEUL);
        tcg_gen_shr_tl(tcg_ctx, t0, t0, t1);
        tcg_gen_xori_tl(tcg_ctx, t1, t1, 31);
        t2 = tcg_const_tl(tcg_ctx, 0xfffffffeull);
        tcg_gen_shl_tl(tcg_ctx, t2, t2, t1);
        gen_load_gpr(tcg_ctx, t1, rt);
        tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
        tcg_temp_free(tcg_ctx, t2);
        tcg_gen_or_tl(tcg_ctx, t0, t0, t1);
        tcg_temp_free(tcg_ctx, t1);
        tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case OPC_LLE:
        mem_idx = MIPS_HFLAG_UM;
        /* fall through */
    case OPC_LL:
    case R6_OPC_LL:
        op_ld_ll(tcg_ctx, t0, t0, mem_idx, ctx);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
}